

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void tf_do_filtering(AV1_COMP *cpi)

{
  long in_RDI;
  int mb_row;
  MB_MODE_INFO **input_mb_mode_info;
  uint8_t *input_buffer [3];
  MACROBLOCKD *mbd;
  int num_planes;
  scale_factors *scale;
  TemporalFilterCtx *tf_ctx;
  ThreadData_conflict *td;
  int in_stack_00000124;
  ThreadData_conflict *in_stack_00000128;
  AV1_COMP *in_stack_00000130;
  int local_54;
  MB_MODE_INFO **local_50;
  uint8_t *local_48 [3];
  MACROBLOCKD *local_30;
  int local_24;
  scale_factors *local_20;
  long local_18;
  long local_10;
  
  local_10 = in_RDI + 0x15030;
  local_18 = in_RDI + 0x42a50;
  local_20 = (scale_factors *)(in_RDI + 0x42be8);
  local_24 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  local_30 = (MACROBLOCKD *)(local_10 + 0x1a0);
  tf_save_state(local_30,&local_50,local_48,local_24);
  tf_setup_macroblockd(local_30,(TemporalFilterData *)(local_10 + 0x25d90),local_20);
  for (local_54 = 0; local_54 < *(int *)(local_18 + 0x1c4); local_54 = local_54 + 1) {
    av1_tf_do_filtering_row(in_stack_00000130,in_stack_00000128,in_stack_00000124);
  }
  tf_restore_state(local_30,local_50,local_48,local_24);
  return;
}

Assistant:

static void tf_do_filtering(AV1_COMP *cpi) {
  // Basic information.
  ThreadData *td = &cpi->td;
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  const struct scale_factors *scale = &tf_ctx->sf;
  const int num_planes = av1_num_planes(&cpi->common);
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);

  MACROBLOCKD *mbd = &td->mb.e_mbd;
  uint8_t *input_buffer[MAX_MB_PLANE];
  MB_MODE_INFO **input_mb_mode_info;
  tf_save_state(mbd, &input_mb_mode_info, input_buffer, num_planes);
  tf_setup_macroblockd(mbd, &td->tf_data, scale);

  // Perform temporal filtering for each row.
  for (int mb_row = 0; mb_row < tf_ctx->mb_rows; mb_row++)
    av1_tf_do_filtering_row(cpi, td, mb_row);

  tf_restore_state(mbd, input_mb_mode_info, input_buffer, num_planes);
}